

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolveTriangular.h
# Opt level: O0

void Eigen::internal::
     triangular_solver_selector<const_Eigen::Matrix<float,_-1,_-1,_0,_4,_4>,_Eigen::Matrix<float,_-1,_-1,_0,_4,_4>,_1,_5,_0,_-1>
     ::run(Matrix<float,__1,__1,_0,_4,_4> *lhs,Matrix<float,__1,__1,_0,_4,_4> *rhs)

{
  PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_4,_4>_> *this;
  Index size_00;
  Index otherSize;
  Index IVar1;
  Index IVar2;
  Scalar *_tri;
  Index triStride;
  Scalar *_other;
  Index otherStride;
  undefined1 local_1e8 [8];
  BlockingType blocking;
  Index othersize;
  Index size;
  type actualLhs;
  Matrix<float,__1,__1,_0,_4,_4> *rhs_local;
  Matrix<float,__1,__1,_0,_4,_4> *lhs_local;
  
  this = &blas_traits<Eigen::Matrix<float,_-1,_-1,_0,_4,_4>_>::extract(lhs)->
          super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_4,_4>_>;
  size_00 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_4,_4>_>::rows
                      (&lhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_4,_4>_>);
  otherSize = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_4,_4>_>::cols
                        (&rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_4,_4>_>);
  IVar1 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_4,_4>_>::rows
                    (&rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_4,_4>_>);
  IVar2 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_4,_4>_>::cols
                    (&rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_4,_4>_>);
  gemm_blocking_space<0,_float,_float,_4,_4,_4,_4,_true>::gemm_blocking_space
            ((gemm_blocking_space<0,_float,_float,_4,_4,_4,_4,_true> *)local_1e8,IVar1,IVar2,size_00
            );
  _tri = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_4,_4>_>::coeffRef(this,0,0);
  triStride = Matrix<float,_-1,_-1,_0,_4,_4>::outerStride((Matrix<float,__1,__1,_0,_4,_4> *)this);
  _other = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_4,_4>_>::coeffRef
                     (&rhs->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,_4,_4>_>,0,0);
  otherStride = Matrix<float,_-1,_-1,_0,_4,_4>::outerStride(rhs);
  triangular_solve_matrix<float,_long,_1,_5,_false,_0,_0>::run
            (size_00,otherSize,_tri,triStride,_other,otherStride,
             (level3_blocking<float,_float> *)local_1e8);
  return;
}

Assistant:

static void run(const Lhs& lhs, Rhs& rhs)
  {
    typename internal::add_const_on_value_type<ActualLhsType>::type actualLhs = LhsProductTraits::extract(lhs);

    const Index size = lhs.rows();
    const Index othersize = Side==OnTheLeft? rhs.cols() : rhs.rows();

    typedef internal::gemm_blocking_space<(Rhs::Flags&RowMajorBit) ? RowMajor : ColMajor,Scalar,Scalar,
              Rhs::MaxRowsAtCompileTime, Rhs::MaxColsAtCompileTime, Lhs::MaxRowsAtCompileTime,4> BlockingType;

    BlockingType blocking(rhs.rows(), rhs.cols(), size);

    triangular_solve_matrix<Scalar,Index,Side,Mode,LhsProductTraits::NeedToConjugate,(int(Lhs::Flags) & RowMajorBit) ? RowMajor : ColMajor,
                               (Rhs::Flags&RowMajorBit) ? RowMajor : ColMajor>
      ::run(size, othersize, &actualLhs.coeffRef(0,0), actualLhs.outerStride(), &rhs.coeffRef(0,0), rhs.outerStride(), blocking);
  }